

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateConstructorCode
          (SingularStringView *this,Printer *p)

{
  bool bVar1;
  
  bVar1 = (this->super_FieldGeneratorBase).is_inlined_;
  if (((bVar1 != true) ||
      (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
       (string *)0x0)) && ((this->super_FieldGeneratorBase).is_oneof_ == false)) {
    if (bVar1 != false) {
      cpp::(anonymous_namespace)::SingularStringView::GenerateConstructorCode();
    }
    io::Printer::Emit(p,0,0,0x1f,"\n    $field_$.InitDefault();\n  ");
    if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ ==
        (string *)0x0) {
      io::Printer::Emit(p,0,0,0x6b,
                        "\n      if ($pbi$::DebugHardenForceCopyDefaultString()) {\n        $field_$.Set(\"\", GetArena());\n      }\n    "
                       );
      return;
    }
  }
  return;
}

Assistant:

void SingularStringView::GenerateConstructorCode(io::Printer* p) const {
  if ((is_inlined() && EmptyDefault()) || is_oneof()) return;
  ABSL_DCHECK(!is_inlined());

  p->Emit(R"cc(
    $field_$.InitDefault();
  )cc");

  if (EmptyDefault()) {
    p->Emit(R"cc(
      if ($pbi$::DebugHardenForceCopyDefaultString()) {
        $field_$.Set("", GetArena());
      }
    )cc");
  }
}